

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec2 vec2_reflect(vec2 u,vec2 v)

{
  vec2 vVar1;
  vec2 vVar2;
  undefined4 local_18;
  undefined4 uStack_14;
  
  vVar1 = vec2_perpindicular_component(u,v);
  vVar2 = vec2_parallel_component(u,v);
  local_18 = vVar1.x;
  uStack_14 = vVar1.y;
  vVar1.y = uStack_14 - vVar2.y;
  vVar1.x = local_18 - vVar2.x;
  return vVar1;
}

Assistant:

vec2 vec2_reflect(vec2 u, vec2 v) {
    return vec2_sub(vec2_perpindicular_component(u, v), vec2_parallel_component(u, v));
}